

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_CCtx_params params)

{
  ZSTD_compressionParameters cParams;
  uint uVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  size_t in_stack_0000000c;
  size_t in_stack_00000014;
  ZSTD_compressionParameters *in_stack_0000001c;
  U32 in_stack_00000024;
  size_t err_code_1;
  size_t dictID;
  size_t err_code;
  void *internalBuffer;
  undefined4 in_stack_ffffffffffffff74;
  ZSTD_cwksp *in_stack_ffffffffffffff78;
  ZSTD_cwksp *in_stack_ffffffffffffff80;
  ZSTD_strategy in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ldmState_t *ls;
  ZSTD_matchState_t *ms;
  ZSTD_compressedBlockState_t *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffb0;
  ZSTD_dictContentType_e dictContentType_00;
  ZSTD_dictTableLoadMethod_e dtlm;
  size_t sVar5;
  ZSTD_tableFillPurpose_e tfp;
  U32 UVar6;
  undefined4 in_stack_ffffffffffffffd4;
  size_t local_8;
  
  ms = (ZSTD_matchState_t *)&stack0x00000008;
  cParams.chainLog = in_stack_ffffffffffffff74;
  cParams.windowLog = in_stack_00000024;
  cParams._8_8_ = in_stack_ffffffffffffff78;
  cParams._16_8_ = in_stack_ffffffffffffff80;
  cParams.strategy = in_stack_ffffffffffffff88;
  sVar4 = in_stack_0000000c;
  sVar5 = in_stack_00000014;
  UVar6 = in_stack_00000024;
  sVar2 = ZSTD_checkCParams(cParams);
  ls = (ldmState_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  if (sVar2 != 0) {
    __assert_fail("!ZSTD_checkCParams(params.cParams)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6582,
                  "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_CCtx_params)"
                 );
  }
  in_RDI[0x2d] = *(undefined8 *)((long)&(ms->window).nextSrc + 4);
  in_RDI[0x2e] = *(undefined8 *)((long)&(ms->window).base + 4);
  in_RDI[0x2f] = *(undefined8 *)((long)&(ms->window).dictBase + 4);
  *(U32 *)(in_RDI + 0x30) = (ms->window).lowLimit;
  *(undefined4 *)((long)in_RDI + 0xf4) = *(undefined4 *)&ms->hashTable3;
  if (((in_ECX == 1) || (in_RSI == (void *)0x0)) || (in_RDX == 0)) {
    *in_RDI = in_RSI;
  }
  else {
    ls = (ldmState_t *)(in_RDI + 4);
    ZSTD_cwksp_align(in_stack_00000014,in_stack_0000000c);
    in_stack_ffffffffffffffb0 =
         ZSTD_cwksp_reserve_object
                   (in_stack_ffffffffffffff78,CONCAT44(in_stack_ffffffffffffff74,in_stack_00000024))
    ;
    if (in_stack_ffffffffffffffb0 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    *in_RDI = in_stack_ffffffffffffffb0;
    memcpy(in_stack_ffffffffffffffb0,in_RSI,in_RDX);
  }
  in_RDI[1] = in_RDX;
  *(undefined4 *)(in_RDI + 2) = in_R8D;
  pvVar3 = ZSTD_cwksp_reserve_object
                     (in_stack_ffffffffffffff78,
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_00000024));
  in_RDI[3] = pvVar3;
  ZSTD_reset_compressedBlockState((ZSTD_compressedBlockState_t *)(in_RDI + 0x33));
  local_8 = ZSTD_reset_matchState
                      ((ZSTD_matchState_t *)CONCAT44(in_ECX,in_R8D),
                       (ZSTD_cwksp *)CONCAT44(in_stack_ffffffffffffffd4,UVar6),in_stack_0000001c,
                       (ZSTD_paramSwitch_e)(sVar5 >> 0x20),(ZSTD_compResetPolicy_e)sVar5,
                       (ZSTD_indexResetPolicy_e)(sVar4 >> 0x20),(ZSTD_resetTarget_e)in_RDI);
  tfp = (ZSTD_tableFillPurpose_e)in_stack_0000001c;
  dtlm = (ZSTD_dictTableLoadMethod_e)sVar5;
  dictContentType_00 = (ZSTD_dictContentType_e)sVar4;
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    ms->nextToUpdate = 3;
    (ms->window).nbOverflowCorrections = 1;
    sVar4 = ZSTD_compress_insertDictionary
                      (in_stack_ffffffffffffff98,ms,ls,in_stack_ffffffffffffff80,
                       (ZSTD_CCtx_params *)in_RDI[3],(void *)CONCAT44(in_stack_ffffffffffffff74,1),
                       (size_t)in_stack_ffffffffffffffb0,dictContentType_00,dtlm,tfp,
                       (void *)CONCAT44(in_stack_ffffffffffffffd4,UVar6));
    local_8 = sVar4;
    uVar1 = ERR_isError(sVar4);
    if (uVar1 == 0) {
      if (0xffffffff < sVar4) {
        __assert_fail("dictID <= (size_t)(U32)-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x65a7,
                      "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_CCtx_params)"
                     );
      }
      *(int *)(in_RDI + 0x2f6) = (int)sVar4;
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_CCtx_params params)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(params.cParams));
    cdict->matchState.cParams = params.cParams;
    cdict->matchState.dedicatedDictSearch = params.enableDedicatedDictSearch;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation, "NULL pointer!");
        cdict->dictContent = internalBuffer;
        ZSTD_memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;
    cdict->dictContentType = dictContentType;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &params.cParams,
        params.useRowMatchFinder,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict), "");
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, ZSTD_tfp_forCDict, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}